

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

void wabt::anon_unknown_1::ResolveImplicitlyDefinedFunctionType
               (Location *loc,Module *module,FuncDeclaration *decl)

{
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  Index IVar4;
  tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_> tVar5;
  FuncDeclaration *this;
  __uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> local_30;
  
  if (decl->has_func_type == false) {
    IVar4 = Module::GetFuncTypeIndex(module,&decl->sig);
    if (IVar4 == 0xffffffff) {
      tVar5.
      super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
      super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
           operator_new(0x48);
      *(long *)((long)tVar5.
                      super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                      .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 8) = 0;
      *(long *)((long)tVar5.
                      super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                      .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x10) =
           0;
      pcVar1 = (loc->filename)._M_str;
      sVar2 = (loc->field_1).field_1.offset;
      lVar3 = *(long *)((long)&loc->field_1 + 8);
      *(size_t *)
       ((long)tVar5.
              super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
              .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x18) =
           (loc->filename)._M_len;
      *(char **)((long)tVar5.
                       super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                       .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x20) =
           pcVar1;
      *(size_t *)
       ((long)tVar5.
              super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
              .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x28) = sVar2;
      *(long *)((long)tVar5.
                      super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                      .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x30) =
           lVar3;
      *(undefined4 *)
       ((long)tVar5.
              super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
              .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x38) = 4;
      *(undefined ***)
       tVar5.
       super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
       super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
           &PTR__TypeModuleField_0019c2c0;
      this = (FuncDeclaration *)operator_new(0xf0);
      FuncType::FuncType((FuncType *)this,(string_view)ZEXT816(0));
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
                (&(this->sig).param_types,&(decl->sig).param_types);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
                (&(this->sig).result_types,&(decl->sig).result_types);
      if (this != decl) {
        std::
        _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::
        _M_assign_elements<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
                  ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&(this->sig).param_type_names,&(decl->sig).param_type_names._M_h);
        std::
        _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::
        _M_assign_elements<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
                  ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&(this->sig).result_type_names,&(decl->sig).result_type_names._M_h);
      }
      *(FuncDeclaration **)
       ((long)tVar5.
              super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
              .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x40) = this;
      local_30._M_t.
      super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
      super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
           (tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
           (tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
           tVar5.
           super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
           .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl;
      Module::AppendField(module,(unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                                  *)&local_30);
      if ((_Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
          local_30._M_t.
          super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
          .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl !=
          (TypeModuleField *)0x0) {
        (**(code **)(*(long *)local_30._M_t.
                              super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                              .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl +
                    8))();
      }
    }
  }
  return;
}

Assistant:

void ResolveImplicitlyDefinedFunctionType(const Location& loc,
                                          Module* module,
                                          const FuncDeclaration& decl) {
  // Resolve implicitly defined function types, e.g.: (func (param i32) ...)
  if (!decl.has_func_type) {
    Index func_type_index = module->GetFuncTypeIndex(decl.sig);
    if (func_type_index == kInvalidIndex) {
      auto func_type_field = std::make_unique<TypeModuleField>(loc);
      auto func_type = std::make_unique<FuncType>();
      func_type->sig = decl.sig;
      func_type_field->type = std::move(func_type);
      module->AppendField(std::move(func_type_field));
    }
  }
}